

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O0

Corner __thiscall QSizeGripPrivate::corner(QSizeGripPrivate *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  QWidget *pos;
  QSizeGripPrivate *in_RDI;
  long in_FS_OFFSET;
  bool isAtLeft;
  bool isAtBottom;
  QWidget *tlw;
  QSizeGrip *q;
  QPoint sizeGripPos;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc4;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  byte bVar4;
  Corner local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  pos = qt_sizegrip_topLevelWidget
                  ((QWidget *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  QWidget::mapTo((QWidget *)
                 CONCAT17(in_stack_ffffffffffffffc7,
                          CONCAT16(in_stack_ffffffffffffffc6,
                                   CONCAT24(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))),
                 (QWidget *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 (QPoint *)pos);
  iVar2 = QPoint::y((QPoint *)0x67fdea);
  iVar3 = QWidget::height((QWidget *)0x67fdf8);
  bVar4 = iVar3 / 2 <= iVar2;
  iVar2 = QPoint::x((QPoint *)0x67fe1b);
  iVar3 = QWidget::width((QWidget *)0x67fe29);
  if (iVar3 / 2 < iVar2) {
    local_1c = TopRightCorner;
    if ((bVar4 & 1) != 0) {
      local_1c = BottomRightCorner;
    }
  }
  else {
    local_1c = TopLeftCorner;
    if ((bVar4 & 1) != 0) {
      local_1c = BottomLeftCorner;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_1c;
}

Assistant:

Qt::Corner QSizeGripPrivate::corner() const
{
    Q_Q(const QSizeGrip);
    QWidget *tlw = qt_sizegrip_topLevelWidget(const_cast<QSizeGrip *>(q));
    const QPoint sizeGripPos = q->mapTo(tlw, QPoint(0, 0));
    bool isAtBottom = sizeGripPos.y() >= tlw->height() / 2;
    bool isAtLeft = sizeGripPos.x() <= tlw->width() / 2;
    if (isAtLeft)
        return isAtBottom ? Qt::BottomLeftCorner : Qt::TopLeftCorner;
    else
        return isAtBottom ? Qt::BottomRightCorner : Qt::TopRightCorner;
}